

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadNMEADevicex(NMEADEVICE *pNMEADevice)

{
  int local_1c;
  int id;
  NMEADEVICE *pNMEADevice_local;
  
  local_1c = 0;
  do {
    if ((NMEADEVICE *)addrsNMEADevice[local_1c] == pNMEADevice) {
      bExitNMEADevice[local_1c] = 1;
      WaitForThread(NMEADeviceThreadId[local_1c]);
      DeleteCriticalSection(NMEADeviceCS + local_1c);
      resNMEADevice[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadNMEADevicex(NMEADEVICE* pNMEADevice)
{
	int id = 0;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitNMEADevice[id] = TRUE;
	WaitForThread(NMEADeviceThreadId[id]);
	DeleteCriticalSection(&NMEADeviceCS[id]);
	resNMEADevice[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}